

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::AttributePack::updateProgram(AttributePack *this)

{
  deUint32 dVar1;
  DrawTestShaderProgram *this_00;
  AttributePack *this_local;
  
  if (this->m_programID != 0) {
    (*this->m_ctx->_vptr_Context[0x77])(this->m_ctx,(ulong)this->m_programID);
  }
  if ((this->m_program != (ShaderProgram *)0x0) && (this->m_program != (ShaderProgram *)0x0)) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  this_00 = (DrawTestShaderProgram *)operator_new(0x1b0);
  anon_unknown_1::DrawTestShaderProgram::DrawTestShaderProgram
            (this_00,this->m_renderCtx,&this->m_arrays);
  this->m_program = (ShaderProgram *)this_00;
  dVar1 = (*this->m_ctx->_vptr_Context[0x75])(this->m_ctx,this->m_program);
  this->m_programID = dVar1;
  return;
}

Assistant:

void AttributePack::updateProgram (void)
{
	if (m_programID)
		m_ctx.deleteProgram(m_programID);
	if (m_program)
		delete m_program;

	m_program = new DrawTestShaderProgram(m_renderCtx, m_arrays);
	m_programID = m_ctx.createProgram(m_program);
}